

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O3

VkSurfaceKHR
create_surface_glfw(VkInstance instance,GLFWwindow *window,VkAllocationCallbacks *allocator)

{
  VkResult VVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  char *error_msg;
  char *local_18;
  VkSurfaceKHR local_10;
  
  local_10 = (VkSurfaceKHR)0x0;
  VVar1 = glfwCreateWindowSurface(instance,window,allocator,(VkSurfaceKHR_conflict *)&local_10);
  if (VVar1 != VK_SUCCESS) {
    iVar2 = glfwGetError(&local_18);
    if (iVar2 != 0) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      if (local_18 != (char *)0x0) {
        sVar4 = strlen(local_18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_18,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    }
    local_10 = (VkSurfaceKHR)0x0;
  }
  return local_10;
}

Assistant:

VkSurfaceKHR create_surface_glfw(VkInstance instance, GLFWwindow* window, VkAllocationCallbacks* allocator = nullptr) {
    VkSurfaceKHR surface = VK_NULL_HANDLE;
    VkResult err = glfwCreateWindowSurface(instance, window, allocator, &surface);
    if (err) {
        const char* error_msg;
        int ret = glfwGetError(&error_msg);
        if (ret != 0) {
            std::cout << ret << " ";
            if (error_msg != nullptr) std::cout << error_msg;
            std::cout << "\n";
        }
        surface = VK_NULL_HANDLE;
    }
    return surface;
}